

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O3

bool __thiscall DAM::operator<(DAM *this,DAM *rhs)

{
  int iVar1;
  int iVar2;
  byte extraout_var;
  long lVar3;
  bool bVar4;
  
  lVar3 = 0;
  do {
    iVar1 = *(int *)((long)(this->dam)._M_elems + lVar3);
    iVar2 = *(int *)((long)(rhs->dam)._M_elems + lVar3);
    if (iVar1 < iVar2) {
      return true;
    }
  } while ((iVar1 <= iVar2) && (bVar4 = lVar3 != 4, lVar3 = lVar3 + 4, bVar4));
  if (*(long *)(this->dam)._M_elems == *(long *)(rhs->dam)._M_elems) {
    std::__cxx11::string::compare((string *)&this->tag);
    bVar4 = (bool)(extraout_var >> 7);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool operator<(const DAM & rhs) const
    {
        if(dam < rhs.dam)
            return true;
        else if(dam == rhs.dam)
            return tag < rhs.tag;
        else
            return false;
    }